

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall World::World(World *this,string *input_file)

{
  Primitive *pPVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  _Ios_Openmode _Var8;
  char *pcVar9;
  istream *piVar10;
  long *plVar11;
  Sphere *pSVar12;
  ostream *this_00;
  reference ppPVar13;
  undefined8 *in_RDI;
  Primitive *i;
  iterator __end1;
  iterator __begin1;
  vector<Primitive_*,_std::allocator<Primitive_*>_> *__range1;
  string var;
  stringstream fin2;
  string order;
  string type_1;
  string type;
  Light *new_light;
  Primitive *new_primitive;
  string obj;
  ifstream fin;
  Primitive *in_stack_fffffffffffffa68;
  ostream *in_stack_fffffffffffffa70;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  Sphere *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  Plane *in_stack_fffffffffffffa90;
  Light *in_stack_fffffffffffffaa0;
  undefined5 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab5;
  undefined1 in_stack_fffffffffffffab6;
  undefined1 in_stack_fffffffffffffab7;
  Camera *in_stack_fffffffffffffad0;
  vector<int4,_std::allocator<int4>_> *meshes;
  vector<Vector3,_std::allocator<Vector3>_> *points;
  undefined7 in_stack_fffffffffffffb30;
  __normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_> local_498
  ;
  undefined8 *local_490;
  string local_488 [36];
  int local_464;
  string local_460 [32];
  stringstream local_440 [160];
  vector<int4,_std::allocator<int4>_> *in_stack_fffffffffffffc60;
  vector<Vector3,_std::allocator<Vector3>_> *in_stack_fffffffffffffc68;
  Camera *in_stack_fffffffffffffc70;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  Sphere *local_258;
  long *local_250;
  string local_248 [32];
  istream local_228 [552];
  
  Camera::Camera(in_stack_fffffffffffffad0);
  Vector3::Vector3((Vector3 *)(in_RDI + 0x10),0.0);
  std::vector<Vector3,_std::allocator<Vector3>_>::vector
            ((vector<Vector3,_std::allocator<Vector3>_> *)0x1241ca);
  meshes = (vector<int4,_std::allocator<int4>_> *)(in_RDI + 0x17);
  std::vector<int4,_std::allocator<int4>_>::vector((vector<int4,_std::allocator<int4>_> *)0x1241e6);
  points = (vector<Vector3,_std::allocator<Vector3>_> *)(in_RDI + 0x1a);
  std::vector<Primitive_*,_std::allocator<Primitive_*>_>::vector
            ((vector<Primitive_*,_std::allocator<Primitive_*>_> *)0x124202);
  *(undefined4 *)(in_RDI + 0x13) = 4;
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
  if (!(bool)uVar2) {
    pcVar9 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_228,pcVar9,_S_in);
    std::__cxx11::string::string(local_248);
LAB_001242a6:
    piVar10 = std::operator>>(local_228,local_248);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18)));
    if (bVar3) {
      local_250 = (long *)0x0;
      local_258 = (Sphere *)0x0;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      if (bVar3) {
        std::__cxx11::string::string(local_278);
        std::operator>>(local_228,local_278);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if (bVar3) {
          plVar11 = (long *)operator_new(0xd0);
          Sphere::Sphere(in_stack_fffffffffffffa80);
          local_250 = plVar11;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if (bVar3) {
          plVar11 = (long *)operator_new(0xf0);
          Plane::Plane(in_stack_fffffffffffffa90);
          local_250 = plVar11;
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if (bVar3) {
          plVar11 = (long *)operator_new(400);
          Bezier::Bezier((Bezier *)
                         CONCAT17(in_stack_fffffffffffffab7,
                                  CONCAT16(in_stack_fffffffffffffab6,
                                           CONCAT15(in_stack_fffffffffffffab5,
                                                    in_stack_fffffffffffffab0))));
          local_250 = plVar11;
        }
        if (local_250 != (long *)0x0) {
          std::vector<Primitive_*,_std::allocator<Primitive_*>_>::push_back
                    ((vector<Primitive_*,_std::allocator<Primitive_*>_> *)in_stack_fffffffffffffa80,
                     (value_type *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78));
        }
        std::__cxx11::string::~string(local_278);
        goto LAB_001246b6;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      if (bVar3) {
        std::__cxx11::string::string(local_298);
        std::operator>>(local_228,local_298);
        pSVar12 = (Sphere *)operator_new(0x68);
        Light::Light(in_stack_fffffffffffffaa0);
        *in_RDI = pSVar12;
        local_258 = pSVar12;
        std::__cxx11::string::~string(local_298);
        goto LAB_001246b6;
      }
      in_stack_fffffffffffffab7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      if (!(bool)in_stack_fffffffffffffab7) goto LAB_00124663;
    }
    local_490 = in_RDI + 0x1a;
    local_498._M_current =
         (Primitive **)
         std::vector<Primitive_*,_std::allocator<Primitive_*>_>::begin
                   ((vector<Primitive_*,_std::allocator<Primitive_*>_> *)in_stack_fffffffffffffa68);
    std::vector<Primitive_*,_std::allocator<Primitive_*>_>::end
              ((vector<Primitive_*,_std::allocator<Primitive_*>_> *)in_stack_fffffffffffffa68);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>
                               *)in_stack_fffffffffffffa70,
                              (__normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>
                               *)in_stack_fffffffffffffa68), bVar3) {
      ppPVar13 = __gnu_cxx::
                 __normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>
                 ::operator*(&local_498);
      pPVar1 = *ppPVar13;
      (*pPVar1->_vptr_Primitive[1])();
      (*pPVar1->_vptr_Primitive[4])(pPVar1,in_RDI + 0x14,in_RDI + 0x17);
      in_stack_fffffffffffffa70 = operator<<(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      std::operator<<(in_stack_fffffffffffffa70,'\n');
      __gnu_cxx::
      __normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>::
      operator++(&local_498);
    }
    Camera::generateMeshes
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    Light::generateMeshes((Light *)CONCAT17(uVar2,in_stack_fffffffffffffb30),points,meshes);
    std::__cxx11::string::~string(local_248);
    std::ifstream::~ifstream(local_228);
  }
  return;
LAB_00124663:
  in_stack_fffffffffffffab6 =
       std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
  if ((!(bool)in_stack_fffffffffffffab6) ||
     (in_stack_fffffffffffffab5 =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68),
     !(bool)in_stack_fffffffffffffab5)) {
LAB_001246b6:
    this_00 = std::operator<<((ostream *)&std::cout,local_248);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::istream::ignore((long)local_228,0x400);
    std::__cxx11::string::string(local_2b8);
    do {
      in_stack_fffffffffffffaa0 =
           (Light *)std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (local_228,local_2b8,'\n');
      bVar3 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&in_stack_fffffffffffffaa0->hashId +
                                *(long *)(*(long *)in_stack_fffffffffffffaa0 + -0x18)));
      if (!bVar3) break;
      _Var8 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_440,local_2b8,_Var8);
      in_stack_fffffffffffffa90 = (Plane *)local_460;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffa90);
      std::operator>>((istream *)local_440,(string *)in_stack_fffffffffffffa90);
      uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      if ((bool)uVar4) {
        local_464 = 5;
      }
      else {
        uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if ((bool)uVar5) {
          operator>>((stringstream *)in_stack_fffffffffffffa70,(Vector3 *)in_stack_fffffffffffffa68)
          ;
        }
        uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if (((bool)uVar6) && (local_250 != (long *)0x0)) {
          (**(code **)(*local_250 + 0x18))(local_250,local_460,local_440);
        }
        uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if (((bool)uVar7) && (local_258 != (Sphere *)0x0)) {
          in_stack_fffffffffffffa80 = local_258;
          std::__cxx11::string::string(local_488,local_460);
          Light::input((Light *)in_stack_fffffffffffffa90,
                       (string *)
                       CONCAT17(uVar4,CONCAT16(uVar5,CONCAT15(uVar6,CONCAT14(uVar7,
                                                  in_stack_fffffffffffffa88)))),
                       (stringstream *)in_stack_fffffffffffffa80);
          std::__cxx11::string::~string(local_488);
        }
        in_stack_fffffffffffffa7f =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        if ((bool)in_stack_fffffffffffffa7f) {
          Camera::input((Camera *)in_stack_fffffffffffffa80,
                        (string *)CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78),
                        (stringstream *)in_stack_fffffffffffffa70);
        }
        local_464 = 0;
      }
      std::__cxx11::string::~string(local_460);
      std::__cxx11::stringstream::~stringstream(local_440);
    } while (local_464 == 0);
    std::__cxx11::string::~string(local_2b8);
  }
  goto LAB_001242a6;
}

Assistant:

World::World(std::string input_file) {
    SHADE_QUALITY = 4;
    if ( input_file == "" ) return;
    std::ifstream fin( input_file.c_str() );

    std::string obj;
    while ( fin >> obj ) {
        Primitive* new_primitive = NULL;
        Light* new_light = NULL;

        if ( obj == "primitive" ) {
            std::string type;
            fin >> type;
            if (type == "sphere") new_primitive = new Sphere;
            if (type == "plane" ) new_primitive = new Plane;
            if (type == "bezier") new_primitive = new Bezier;
            if (new_primitive != NULL) pris.push_back(new_primitive);
        }
//            if ( type == "rectangle" ) new_primitive = new Rectangle;
//            if ( type == "triangle" ) new_primitive = new Triangle;
//            if ( type == "polyhedron" ) new_primitive = new Polyhedron;
//            AddPrimitive( new_primitive );
//        }
        else
        if ( obj == "light" ) {
            std::string type; fin >> type;
            new_light = new Light;
//            if ( type == "point" ) new_light = new PointLight;
//            if ( type == "area" ) new_light = new AreaLight;
//            AddLight( new_light );
            light = new_light;
        } else
        if (obj == "end") break;
        else if ( obj != "background" && obj != "camera" ) continue;
        std::cout << obj << std::endl;

        fin.ignore( 1024 , '\n' );

        std::string order;
        while ( std::getline( fin , order , '\n' ) ) {
            std::stringstream fin2( order );
            std::string var; fin2 >> var;
            if ( var == "end" ) {
                //if (obj == "primitive" && new_primitive != NULL) new_primitive->PreTreatment();
                break;
            }

            if ( obj == "background") fin2 >> bgc;
            if ( obj == "primitive" && new_primitive != NULL ) new_primitive->input( var , fin2 );
            if ( obj == "light" && new_light != NULL ) new_light->input( var , fin2 );
            if ( obj == "camera" ) camera.input( var , fin2 );
        }
    }
    for (auto i : pris) {
        i->init();
        i->generateMeshes(points, meshes);
        std::cout << *i << '\n';
    }
    camera.generateMeshes(points, meshes);
    light->generateMeshes(points, meshes);
}